

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.h
# Opt level: O2

Type * __thiscall
google::protobuf::util::converter::ProtoWriter::LookupType(ProtoWriter *this,Field *field)

{
  TypeInfo *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  StringPiece local_28;
  
  if ((field->kind_ & 0xfffffffeU) == 10) {
    pTVar1 = this->typeinfo_;
    StringPiece::StringPiece<std::allocator<char>>(&local_28,(field->type_url_).ptr_);
    iVar2 = (*pTVar1->_vptr_TypeInfo[3])(pTVar1,local_28.ptr_,local_28.length_);
    return (Type *)CONCAT44(extraout_var,iVar2);
  }
  return ((this->element_)._M_t.
          super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
          ._M_t.
          super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
          .
          super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
         ._M_head_impl)->type_;
}

Assistant:

inline PROTOBUF_NAMESPACE_ID::Field_Kind Field::_internal_kind() const {
  return static_cast< PROTOBUF_NAMESPACE_ID::Field_Kind >(kind_);
}